

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

var __thiscall cs_impl::array_cs_ext::to_list(array_cs_ext *this,array *arr)

{
  var lst;
  any local_60;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_58;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_38;
  
  local_38._M_cur =
       (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_38._M_first =
       (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_38._M_last =
       (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_38._M_node =
       (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_58._M_cur =
       (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  any::
  make<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>,std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>>
            (&local_60,&local_38,&local_58);
  any::detach(&local_60);
  *(undefined8 *)this = 0;
  *(proxy **)this = local_60.mDat;
  local_60.mDat = (proxy *)0x0;
  any::recycle(&local_60);
  return (var)(proxy *)this;
}

Assistant:

var to_list(const array &arr)
		{
			var lst = var::make<list>(arr.begin(), arr.end());
			lst.detach();
			return std::move(lst);
		}